

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdi.cpp
# Opt level: O3

bool ReadFDI(MemFile *file,shared_ptr<Disk> *disk)

{
  element_type *peVar1;
  byte bVar2;
  char extraout_AL;
  bool bVar3;
  uint16_t uVar4;
  int iVar5;
  int iVar6;
  ssize_t sVar7;
  mapped_type *pmVar8;
  exception *peVar9;
  byte bVar10;
  size_t in_RCX;
  size_t __nbytes;
  uint size;
  uint uVar11;
  bool bVar12;
  FDI_SECTOR fs;
  CRC16 crc;
  FDI_TRACK ft;
  CylHead cylhead;
  FDI_HEADER fh;
  Track track;
  int sector_size;
  int sector_pos;
  Data data;
  Sector sector;
  byte local_135;
  byte local_134;
  byte local_133;
  byte local_132;
  byte local_131;
  ushort local_130;
  CRC16 local_12e;
  uint local_12c;
  char *local_128;
  uint local_120;
  uint local_11c;
  uint3 local_117;
  byte local_111;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  vector<char,_std::allocator<char>_> local_100;
  short local_e6;
  char local_e4;
  byte local_e2;
  byte local_e0;
  ushort local_de;
  ushort local_dc;
  ushort local_da;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  shared_ptr<Disk> *local_b8;
  MemFile *local_b0;
  uint local_a4;
  int local_a0;
  uint local_9c;
  int local_98;
  int local_94;
  Header local_90;
  long local_80 [2];
  DataRate *local_70 [2];
  long local_60 [3];
  vector<Data,_std::allocator<Data>_> local_48;
  
  local_b8 = disk;
  MemFile::rewind(file,(FILE *)disk);
  if (((extraout_AL == '\0') ||
      (sVar7 = MemFile::read(file,(int)&local_e6,(void *)0xe,in_RCX), (char)sVar7 == '\0')) ||
     (local_e4 != 'I' || local_e6 != 0x4446)) {
    return false;
  }
  local_12c = 0;
  uVar11 = (uint)local_e2;
  local_10c = (uint)local_e0;
  __nbytes = 0x200;
  Format::Validate(uVar11,local_10c,1,0x200,0);
  local_110 = (uint)local_dc;
  MemFile::seek(file,local_da + 0xe);
  local_a4 = uVar11;
  if (local_e2 != 0) {
    local_b0 = file;
    do {
      if ((char)local_10c != '\0') {
        uVar11 = 0;
        do {
          local_120 = uVar11;
          CylHead::CylHead((CylHead *)&local_100,local_12c,local_120);
          Track::Track((Track *)local_d8,0);
          sVar7 = MemFile::read(file,(int)&local_117,(void *)0x7,__nbytes);
          if ((char)sVar7 == '\0') {
            peVar9 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<char_const(&)[20],CylHead&>
                      (peVar9,(char (*) [20])"short file reading ",(CylHead *)&local_100);
LAB_001913c5:
            __cxa_throw(peVar9,&util::exception::typeinfo,std::runtime_error::~runtime_error);
          }
          __nbytes = CONCAT71((int7)(__nbytes >> 8),local_111);
          if (0x90 < local_111) {
            peVar9 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<CylHead&,char_const(&)[24],unsigned_char&,char_const(&)[2]>
                      (peVar9,(CylHead *)&local_100,(char (*) [24])" has too many sectors (",
                       &local_111,(char (*) [2])0x1aefd0);
            goto LAB_001913c5;
          }
          local_104 = 0;
          if (local_111 != 0) {
            local_a0 = local_117 + local_110;
            do {
              local_11c = local_104;
              sVar7 = MemFile::read(file,(int)&local_135,(void *)0x7,__nbytes);
              if ((char)sVar7 == '\0') {
                peVar9 = (exception *)__cxa_allocate_exception(0x10);
                util::exception::exception<char_const(&)[20],CylHead&,char_const(&)[15],int&>
                          (peVar9,(char (*) [20])"short file reading ",(CylHead *)&local_100,
                           (char (*) [15])" sector index ",(int *)&local_104);
                __cxa_throw(peVar9,&util::exception::typeinfo,std::runtime_error::~runtime_error);
              }
              Header::Header(&local_90,(uint)local_135,(uint)local_134,(uint)local_133,
                             (uint)local_132);
              Sector::Sector((Sector *)local_70,_250K,MFM,&local_90,0);
              bVar10 = local_131;
              bVar12 = -1 < (char)local_131;
              iVar5 = MemFile::tell(file);
              local_94 = (uint)local_130 + local_a0;
              bVar3 = MemFile::seek(file,local_94);
              if (!bVar3) {
                peVar9 = (exception *)__cxa_allocate_exception(0x10);
                util::exception::
                exception<char_const(&)[19],CylHead&,char_const(&)[9],unsigned_char&,char_const(&)[8],int&>
                          (peVar9,(char (*) [19])"failed to seek to ",(CylHead *)&local_100,
                           (char (*) [9])0x1b0f43,&local_133,(char (*) [8])" data @",&local_94);
                __cxa_throw(peVar9,&util::exception::typeinfo,std::runtime_error::~runtime_error);
              }
              uVar11 = local_132 & 3;
              local_98 = Sector::SizeCodeToLength(uVar11);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,
                         (long)local_98,(allocator_type *)&local_128);
              MemFile::read(local_b0,local_90.cyl,(void *)0x1,
                            (ulong)(uint)(local_90.sector - local_90.cyl));
              MemFile::seek(local_b0,iVar5);
              bVar3 = true;
              local_108 = (uint)(byte)(bVar12 * '\x03' - 8);
              if ((bVar10 & 0x40) == 0) {
                local_9c = 1 << (sbyte)uVar11;
                size = 0;
                do {
                  iVar5 = Sector::SizeCodeToLength(size);
                  iVar6 = Sector::SizeCodeToLength((uint)local_132);
                  bVar10 = (byte)size;
                  if (iVar5 == iVar6) {
                    bVar10 = (byte)(1 << (bVar10 & 0x1f));
                    bVar3 = (bool)(bVar3 & (local_131 >> (size & 0x1f) & 1) == 0);
LAB_00190faa:
                    local_131 = ~bVar10 & local_131;
                  }
                  else if (size <= uVar11) {
                    CRC16::CRC16(&local_12e,0xcdb4);
                    CRC16::add(&local_12e,local_108);
                    CRC16::add(&local_12e,(void *)local_90._0_8_,(long)iVar5);
                    if (uVar11 == size) {
                      if ((local_9c & local_131) != 0) {
                        uVar4 = CRC16::operator_cast_to_unsigned_short(&local_12e);
                        local_128._0_1_ = SUB21(uVar4 >> 8,0);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                        emplace_back<unsigned_char>
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &local_90,(uchar *)&local_128);
                        uVar4 = CRC16::operator_cast_to_unsigned_short(&local_12e);
                        local_128 = (char *)CONCAT71(local_128._1_7_,(char)uVar4);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                        emplace_back<unsigned_char>
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &local_90,(uchar *)&local_128);
                      }
                    }
                    else {
                      CRC16::add(&local_12e,(void *)((long)iVar5 + local_90._0_8_),2);
                      bVar2 = local_131;
                      uVar4 = CRC16::operator_cast_to_unsigned_short(&local_12e);
                      if (((uVar4 != 0 ^ bVar2 >> (bVar10 & 0x1f)) & 1) == 0) {
                        local_128 = CHR(local_12c,local_120,(uint)local_133);
                        Message<int&,char_const*>
                                  (msgWarning,"inconsistent CRC flag for size=%d for %s",&local_98,
                                   &local_128);
                      }
                    }
                    bVar10 = (byte)(1 << (bVar10 & 0x1f));
                    goto LAB_00190faa;
                  }
                  bVar12 = size < 3;
                  size = size + 1;
                } while (bVar12);
              }
              if ((local_131 & 0x3f) != 0) {
                local_128 = CHSR(local_12c,local_120,local_11c,(uint)local_133);
                Message<unsigned_char&,char_const*>
                          (msgWarning,"unexpected flags (%02X) on %s",&local_131,&local_128);
              }
              Sector::add((Sector *)local_70,(Data *)&local_90,bVar3,(uint8_t)local_108);
              Track::add((Track *)local_d8,(Sector *)local_70);
              if ((long *)local_90._0_8_ != (long *)0x0) {
                operator_delete((void *)local_90._0_8_,local_80[0] - local_90._0_8_);
              }
              std::vector<Data,_std::allocator<Data>_>::~vector(&((Sector *)local_70)->m_data);
              local_11c = local_11c + 1;
              __nbytes = (size_t)local_11c;
              file = local_b0;
              local_104 = local_11c;
            } while (local_11c < local_111);
          }
          Disk::write((local_b8->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                      (int)&local_100,local_d8,__nbytes);
          std::vector<Sector,_std::allocator<Sector>_>::~vector
                    ((vector<Sector,_std::allocator<Sector>_> *)(local_d8 + 8));
          uVar11 = local_120 + 1;
        } while (local_120 + 1 != local_10c);
      }
      local_12c = local_12c + 1;
    } while (local_12c != local_a4);
  }
  if (local_de != 0) {
    uVar11 = (uint)local_de;
    bVar3 = MemFile::seek(file,uVar11);
    if (bVar3) {
      iVar5 = 0x100;
      if (uVar11 <= local_110 && local_110 - uVar11 != 0) {
        iVar5 = local_110 - uVar11;
      }
      std::vector<char,_std::allocator<char>_>::vector
                (&local_100,(long)iVar5,(allocator_type *)local_70);
      iVar6 = (int)local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
              (int)local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
      iVar5 = MemFile::remaining(file);
      if (iVar5 < iVar6) {
        peVar9 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[27]>
                  (peVar9,(char (*) [27])"short file reading comment");
        __cxa_throw(peVar9,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
      memcpy(local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,(file->m_it)._M_current,(long)iVar6);
      (file->m_it)._M_current = (file->m_it)._M_current + iVar6;
      local_70[0] = &((Sector *)local_70)->datarate;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,
                 local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::__cxx11::string::substr((ulong)local_d8,(ulong)local_70);
      iVar5 = std::__cxx11::string::compare(local_d8);
      if (iVar5 == 0) {
        bVar3 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_90,(ulong)local_70);
        iVar5 = std::__cxx11::string::compare((char *)&local_90);
        bVar3 = iVar5 != 0;
        if ((long *)local_90._0_8_ != local_80) {
          operator_delete((void *)local_90._0_8_,local_80[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_allocated_capacity + 1));
      }
      if (bVar3) {
        peVar1 = (local_b8->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_d8._0_8_ = &local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"comment","");
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&peVar1->metadata,(key_type *)local_d8);
        std::__cxx11::string::_M_assign((string *)pmVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._0_8_ != &local_c8) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_allocated_capacity + 1));
        }
      }
      if (local_70[0] != &((Sector *)local_70)->datarate) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if ((CylHead)local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start != (CylHead)0x0) {
        operator_delete(local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  peVar1 = (local_b8->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::_M_replace
            ((ulong)&peVar1->strType,0,(char *)(peVar1->strType)._M_string_length,0x1b0d0a);
  return true;
}

Assistant:

bool ReadFDI(MemFile& file, std::shared_ptr<Disk>& disk)
{
    FDI_HEADER fh;
    if (!file.rewind() || !file.read(&fh, sizeof(fh)))
        return false;
    else if (memcmp(fh.abSignature, FDI_SIGNATURE, sizeof(fh.abSignature)))
        return false;

    int cyls = fh.bTracks[0];
    int heads = fh.bSides[0];
    Format::Validate(cyls, heads);

    auto data_pos = (fh.bDataOffset[1] << 8) | fh.bDataOffset[0];
    auto header_pos = static_cast<int>(sizeof(FDI_HEADER)) + ((fh.bExtraSize[1] << 8) | fh.bExtraSize[0]);
    file.seek(header_pos);

    //  uint8_t* pbData = pb + fh.bDataOffset[0];
    //  auto pbHeaders = (uint8_t*)&fh.bExtraSize + sizeof(fh.bExtraSize) + ((fh.bExtraSize[1] << 8) | fh.bExtraSize[0]);

    for (auto cyl = 0; cyl < cyls; ++cyl)
    {
        for (auto head = 0; head < heads; ++head)
        {
            CylHead cylhead(cyl, head);
            Track track;

            FDI_TRACK ft;
            if (!file.read(&ft, sizeof(ft)))
                throw util::exception("short file reading ", cylhead);

            if (ft.sectors > MAX_SECTORS)
                throw util::exception(cylhead, " has too many sectors (", ft.sectors, ")");

            auto track_pos = data_pos + (/*(ft.abTrackOffset[3] << 24) |*/ (ft.abTrackOffset[2] << 16) |
                (ft.abTrackOffset[1] << 8) | ft.abTrackOffset[0]);

            for (int i = 0; i < ft.sectors; ++i)
            {
                FDI_SECTOR fs;
                if (!file.read(&fs, sizeof(fs)))
                    throw util::exception("short file reading ", cylhead, " sector index ", i);

                Sector sector(DataRate::_250K, Encoding::MFM, Header(fs.bTrack, fs.bSide, fs.bSector, fs.bSize));

                bool deleted_data = (fs.bFlags & 0x80) != 0;
                bool no_data = (fs.bFlags & 0x40) != 0;
                bool bad_data = true;   // until we learn otherwise
                uint8_t dam = deleted_data ? 0xf8 : 0xfb;

                auto old_pos = file.tell();
                auto sector_pos = track_pos + ((fs.bSectorOffset[1] << 8) | fs.bSectorOffset[0]);
                if (!file.seek(sector_pos))
                    throw util::exception("failed to seek to ", cylhead, " sector ", fs.bSector, " data @", sector_pos);

                // Use only 2 bits of the size, to match FD1793 behaviour
                uint8_t b1793Size = fs.bSize & 3;
                auto sector_size = Sector::SizeCodeToLength(b1793Size);

                Data data(sector_size); // always allocate full PC size, plus room for CRC
                file.read(data.data(), 1, static_cast<int>(data.size()));
                file.seek(old_pos);

                // Loop through valid size codes to check the flag bits
                for (uint8_t size = 0; !no_data && size <= 3; ++size)
                {
                    auto ssize = Sector::SizeCodeToLength(size);

                    // Does the size match the PC treatment of the size code?
                    if (ssize == Sector::SizeCodeToLength(fs.bSize))
                    {
                        // If the flags say no error, clear the data CRC error
                        if (fs.bFlags & (1 << size))
                            bad_data = false;
                    }
                    // Or is it within the current FD1793 size?
                    else if (size <= b1793Size)
                    {
                        CRC16 crc(CRC16::A1A1A1);
                        crc.add(dam);
                        crc.add(data.data(), ssize);

                        // If the size matches, there are no CRC bytes in the data
                        if (size == b1793Size)
                        {
                            // Do the flags indicate the CRC is good?
                            if (fs.bFlags & (1 << size))
                            {
                                // Add the calculated CRC bytes to to preserve the status
                                data.push_back(crc >> 8);
                                data.push_back(crc & 0xff);
                            }
                        }
                        else
                        {
                            // Continue reading into the data to check the CRC
                            crc.add(data.data() + ssize, 2);

                            // Ensure the CRC status matches the flags
                            if (!!(fs.bFlags & (1 << size)) != (crc ? 0 : 1))
                                Message(msgWarning, "inconsistent CRC flag for size=%d for %s", sector_size, CHR(cyl, head, fs.bSector));
                        }
                    }
                    else
                    {
                        // Skip clearing the flag so we warn any set bit below
                        continue;
                    }

                    // Reset the bit for this size, whether or not we used it
                    fs.bFlags &= ~(1 << size);
                }

                // Warn about any remaining flags, in case we're missing something
                if (fs.bFlags & ~0xc0)
                    Message(msgWarning, "unexpected flags (%02X) on %s", fs.bFlags, CHSR(cyl, head, i, fs.bSector));

                sector.add(std::move(data), bad_data, dam);
                track.add(std::move(sector));
            }

            disk->write(cylhead, std::move(track));
        }
    }

    auto desc_pos = (fh.bDescOffset[1] << 8) | fh.bDescOffset[0];
    if (desc_pos && file.seek(desc_pos))
    {
        // Read the comment block
        auto len = (data_pos > desc_pos) ? (data_pos - desc_pos) : 256;
        std::vector<char> comment(len);
        if (!file.read(comment))
            throw util::exception("short file reading comment");
        std::string str = std::string(comment.data(), comment.size());

        // To avoid confusion, don't store the default TDCVT comment
        if (str.substr(0, 29) != "\r\n'This file created by TDCVT" && str.substr(0, 3) != "FDI")
            disk->metadata["comment"] = str;
    }

    disk->strType = "FDI";
    return true;
}